

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_deref(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  LY_DATA_TYPE LVar1;
  lyxp_set *set_00;
  lysc_node *plVar2;
  lysc_type_leafref *lref;
  ly_bool lVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  lysc_node *plVar6;
  char *pcVar7;
  long lVar8;
  char *format;
  ly_ctx *plVar9;
  ulong uVar10;
  ly_set *set_01;
  ly_set *targets;
  char *errmsg;
  ly_path *p;
  
  errmsg = (char *)0x0;
  targets = (ly_set *)0x0;
  set_00 = *args;
  if ((options & 0x1c) == 0) {
    if (set_00->type != LYXP_SET_NODE_SET) {
      plVar9 = set->ctx;
      pcVar7 = print_set_type(set_00);
      ly_vlog(plVar9,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar7,
              "deref(node-set)");
      LVar4 = LY_EVALID;
      set_01 = (ly_set *)0x0;
      goto LAB_001a5ff3;
    }
    lyxp_set_free_content(set);
    if ((*args)->used != 0) {
      plVar6 = (((*args)->val).scnodes)->scnode;
      if (((ulong)plVar6->module->ctx & 0xc) != 0) {
        lref = (lysc_type_leafref *)plVar6->module->identities;
        LVar1 = lref->basetype;
        if (LVar1 == LY_TYPE_INST) {
          LVar4 = LY_SUCCESS;
          LVar5 = ly_path_eval((ly_path *)plVar6->priv,set->tree,(lyxp_var *)0x0,(lyd_node **)&p);
          if (LVar5 == LY_SUCCESS) {
            set_insert_node(set,(lyd_node *)p,0,LYXP_NODE_ELEM,0);
            set_01 = (ly_set *)0x0;
          }
          else {
            plVar9 = set->ctx;
            pcVar7 = lyd_get_value((lyd_node *)plVar6);
            set_01 = (ly_set *)0x0;
            LVar4 = LY_EINVAL;
            ly_log(plVar9,LY_LLERR,LY_EINVAL,
                   "Invalid instance-identifier \"%s\" value - required instance not found.",pcVar7)
            ;
          }
        }
        else {
          if (LVar1 != LY_TYPE_LEAFREF) {
            __assert_fail("sleaf->type->basetype == LY_TYPE_INST",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0xff3,
                          "LY_ERR xpath_deref(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                         );
          }
          LVar4 = lyplg_type_resolve_leafref
                            (lref,(lyd_node *)plVar6,(lyd_value *)&plVar6->ref,set->tree,&targets,
                             &errmsg);
          if (LVar4 == LY_SUCCESS) {
            LVar4 = LY_SUCCESS;
            for (uVar10 = 0; set_01 = targets, uVar10 < targets->count; uVar10 = uVar10 + 1) {
              set_insert_node(set,(targets->field_2).dnodes[uVar10],0,LYXP_NODE_ELEM,0);
            }
          }
          else {
            LVar4 = LY_EINVAL;
            ly_log(set->ctx,LY_LLERR,LY_EINVAL,"%s",errmsg);
            free(errmsg);
            set_01 = targets;
          }
        }
        goto LAB_001a5ff3;
      }
    }
  }
  else {
    if (set_00->type == LYXP_SET_SCNODE_SET) {
      plVar6 = warn_get_scnode_in_ctx(set_00);
      if (plVar6 == (lysc_node *)0x0) {
        plVar6 = (lysc_node *)0x0;
      }
      else {
        if ((plVar6->nodetype & 0xc) == 0) {
          plVar9 = set->ctx;
          pcVar7 = lys_nodetype2str(plVar6->nodetype);
          format = "Argument #1 of %s is a %s node \"%s\".";
        }
        else {
          plVar2 = plVar6[1].parent;
          lVar3 = warn_is_specific_type((lysc_type *)plVar2,LY_TYPE_LEAFREF);
          if ((lVar3 != '\0') ||
             (lVar3 = warn_is_specific_type((lysc_type *)plVar2,LY_TYPE_INST), lVar3 != '\0'))
          goto LAB_001a5f68;
          plVar9 = set->ctx;
          pcVar7 = plVar6->name;
          format = 
          "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\".";
        }
        ly_log(plVar9,LY_LLWRN,LY_SUCCESS,format,"xpath_deref",pcVar7);
      }
    }
    else {
      plVar6 = (lysc_node *)0x0;
      ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
             "xpath_deref");
    }
LAB_001a5f68:
    set_scnode_clear_ctx(set,1);
    if (((plVar6 != (lysc_node *)0x0) && ((plVar6->nodetype & 0xc) != 0)) &&
       (plVar2 = plVar6[1].parent, *(int *)&plVar2->next == 0xe)) {
      LVar5 = ly_path_compile_leafref
                        (set->ctx,plVar6,(lysc_ext_instance *)0x0,(lyxp_expr *)plVar2->prev,
                         ((plVar6->flags >> 0xd & 1) != 0) + 1,0x20,LY_VALUE_SCHEMA_RESOLVED,
                         plVar2->name,&p);
      LVar4 = LY_SUCCESS;
      set_01 = (ly_set *)0x0;
      if (LVar5 == LY_SUCCESS) {
        if (p == (ly_path *)0x0) {
          lVar8 = -1;
        }
        else {
          lVar8 = (long)&p[-1].predicates[-1].field_1.position + 0x2f;
        }
        plVar6 = p[lVar8].node;
        ly_path_free(p);
        set_01 = (ly_set *)0x0;
        LVar5 = lyxp_set_scnode_insert_node
                          (set,plVar6,LYXP_NODE_ELEM,LYXP_AXIS_SELF,(uint32_t *)0x0);
        LVar4 = LY_SUCCESS;
        if (LVar5 != LY_SUCCESS) {
          return LY_EMEM;
        }
      }
      goto LAB_001a5ff3;
    }
  }
  LVar4 = LY_SUCCESS;
  set_01 = (ly_set *)0x0;
LAB_001a5ff3:
  ly_set_free(set_01,(_func_void_void_ptr *)0x0);
  return LVar4;
}

Assistant:

static LY_ERR
xpath_deref(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lyd_node_term *leaf;
    struct lysc_node_leaf *sleaf = NULL;
    struct lysc_type_leafref *lref;
    const struct lysc_node *target;
    struct ly_path *p;
    struct lyd_node *node;
    char *errmsg = NULL;
    uint8_t oper;
    LY_ERR r;
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *targets = NULL;
    uint32_t i;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type != LYXP_SET_SCNODE_SET) {
            LOGWRN(set->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
        } else if ((sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & LYD_NODE_TERM)) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_specific_type(sleaf->type, LY_TYPE_LEAFREF) &&
                    !warn_is_specific_type(sleaf->type, LY_TYPE_INST)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\".",
                        __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        if (sleaf && (sleaf->nodetype & LYD_NODE_TERM) && (sleaf->type->basetype == LY_TYPE_LEAFREF)) {
            lref = (struct lysc_type_leafref *)sleaf->type;
            oper = (sleaf->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT;

            /* it was already evaluated on schema, it must succeed */
            r = ly_path_compile_leafref(set->ctx, &sleaf->node, NULL, lref->path, oper, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &p);
            if (!r) {
                /* get the target node */
                target = p[LY_ARRAY_COUNT(p) - 1].node;
                ly_path_free(p);

                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, target, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
            } /* else the target was found before but is disabled so it was removed */
        }

        ret = LY_SUCCESS;
        goto cleanup;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "deref(node-set)");
        ret = LY_EVALID;
        goto cleanup;
    }

    lyxp_set_free_content(set);
    if (args[0]->used) {
        leaf = (struct lyd_node_term *)args[0]->val.nodes[0].node;
        sleaf = (struct lysc_node_leaf *)leaf->schema;
        if (sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (sleaf->type->basetype == LY_TYPE_LEAFREF) {
                /* find leafref target */
                r = lyplg_type_resolve_leafref((struct lysc_type_leafref *)sleaf->type, &leaf->node, &leaf->value, set->tree,
                        &targets, &errmsg);
                if (r) {
                    LOGERR(set->ctx, LY_EINVAL, "%s", errmsg);
                    free(errmsg);
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert nodes into set */
                for (i = 0; i < targets->count; ++i) {
                    set_insert_node(set, targets->dnodes[i], 0, LYXP_NODE_ELEM, 0);
                }
            } else {
                assert(sleaf->type->basetype == LY_TYPE_INST);
                if (ly_path_eval(leaf->value.target, set->tree, NULL, &node)) {
                    LOGERR(set->ctx, LY_EINVAL, "Invalid instance-identifier \"%s\" value - required instance not found.",
                            lyd_get_value(&leaf->node));
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert it */
                set_insert_node(set, node, 0, LYXP_NODE_ELEM, 0);
            }
        }
    }

cleanup:
    ly_set_free(targets, NULL);
    return ret;
}